

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.c
# Opt level: O1

void mbedtls_entropy_free(mbedtls_entropy_context *ctx)

{
  long lVar1;
  
  mbedtls_sha512_free(&ctx->accumulator);
  ctx->source_count = 0;
  lVar1 = 0xe8;
  do {
    *(undefined1 *)((long)(ctx->accumulator).total + lVar1 + -8) = 0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x408);
  ctx->accumulator_started = 0;
  return;
}

Assistant:

void mbedtls_entropy_free( mbedtls_entropy_context *ctx )
{
#if defined(MBEDTLS_HAVEGE_C)
    mbedtls_havege_free( &ctx->havege_data );
#endif
#if defined(MBEDTLS_THREADING_C)
    mbedtls_mutex_free( &ctx->mutex );
#endif
#if defined(MBEDTLS_ENTROPY_SHA512_ACCUMULATOR)
    mbedtls_sha512_free( &ctx->accumulator );
#else
    mbedtls_sha256_free( &ctx->accumulator );
#endif
#if defined(MBEDTLS_ENTROPY_NV_SEED)
    ctx->initial_entropy_run = 0;
#endif
    ctx->source_count = 0;
    mbedtls_zeroize( ctx->source, sizeof( ctx->source ) );
    ctx->accumulator_started = 0;
}